

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

Pass * wasm::createReReloopPass(void)

{
  ReReloop *this;
  
  this = (ReReloop *)operator_new(0x90);
  memset(this,0,0x90);
  ReReloop::ReReloop(this);
  return &this->super_Pass;
}

Assistant:

Pass* createReReloopPass() { return new ReReloop(); }